

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

int __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
::AddConstraint<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
           *this,int d,
          ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *args)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int local_c;
  
  local_c = d;
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>::Container>>
  ::
  emplace_back<int&,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
            ((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>::Container>>
              *)(this + 0xd0),&local_c,args);
  lVar1 = *(long *)(this + 0x118);
  lVar2 = *(long *)(this + 0x100);
  uVar3 = lVar2 - *(long *)(this + 0x108);
  if (uVar3 == 0) {
    lVar2 = *(long *)(lVar1 + -8) + 0x1c0;
  }
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
  ::ExportConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                      *)this,(int)(uVar3 >> 5) * -0x49249249 +
                             ((int)((ulong)(lVar1 - *(long *)(this + 0xf8)) >> 3) + -1 +
                             (uint)(lVar1 == 0)) * 2 +
                             (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 5) *
                             -0x49249249 + -1,(Container *)(lVar2 + -0xe0));
  return (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 5) * -0x49249249 +
         (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 5) * -0x49249249 +
         ((int)((ulong)(*(long *)(this + 0x118) - *(long *)(this + 0xf8)) >> 3) + -1 +
         (uint)(*(long *)(this + 0x118) == 0)) * 2 + -1;
}

Assistant:

int AddConstraint(int d, Args&&... args)
  {
    cons_.emplace_back( d, std::move(args)... );
    ExportConstraint(cons_.size()-1, cons_.back());
    // fmt::MemoryWriter wrt;
    // WriteCon2JSON(wrt, cons_.size()-1, cons_.back());
    // printf("%s\n", wrt.c_str());
    return cons_.size()-1;
  }